

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regression.c
# Opt level: O3

void confint(reg_object obj)

{
  double *pdVar1;
  ulong uVar2;
  
  putchar(10);
  printf("%-10lf%% Confidence Interval For Parameters And Residual Variance : \n",
         (1.0 - obj->alpha) * 100.0);
  printf("%-25s%-20s%-20s%-20s \n","Parameters","Value","Lower Limit","Upper Limit");
  if (0 < obj->p) {
    pdVar1 = &obj->beta[0].upper;
    uVar2 = 0;
    do {
      printf("B%-25d%-20lf%-20lf%-20lf \n",((bparam *)(pdVar1 + -2))->value,pdVar1[-1],*pdVar1,
             uVar2 & 0xffffffff);
      uVar2 = uVar2 + 1;
      pdVar1 = pdVar1 + 4;
    } while ((long)uVar2 < (long)obj->p);
  }
  printf("%-25s%-20lf%-20lf%-20lf \n",obj->sigma,obj->sigma_lower,obj->sigma_upper,
         "Residual Variance");
  return;
}

Assistant:

void confint(reg_object obj) {
	int i;
	printf("\n");
	printf("%-10lf%% Confidence Interval For Parameters And Residual Variance : \n", (1.0 - obj->alpha) * 100);
	printf("%-25s%-20s%-20s%-20s \n", "Parameters",
		"Value", "Lower Limit", "Upper Limit");

	for (i = 0; i < obj->p; ++i) {
		printf("B%-25d%-20lf%-20lf%-20lf \n",
			i, (obj->beta + i)->value, (obj->beta + i)->lower, (obj->beta + i)->upper);
	}
	printf("%-25s%-20lf%-20lf%-20lf \n", "Residual Variance",
		obj->sigma, obj->sigma_lower, obj->sigma_upper);
}